

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive_manifest.cpp
# Opt level: O1

void __thiscall
ON_ComponentManifestImpl::DeallocateItem
          (ON_ComponentManifestImpl *this,ON_ComponentManifestItem_PRIVATE *item)

{
  if (item == (ON_ComponentManifestItem_PRIVATE *)0x0) {
    return;
  }
  if (this->m_manifest_impl_sn == item->m_manifest_impl_sn) {
    item->m_manifest_table_sn = 0;
    item->m_manifest_impl_sn = 0;
    ON_FixedSizePool::ReturnElement(&this->m_item_PRIVATE__fsp,item);
    return;
  }
  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive_manifest.cpp"
             ,0xdff,"","item memory corruption.");
  return;
}

Assistant:

void ON_ComponentManifestImpl::DeallocateItem(
  ON_ComponentManifestItem_PRIVATE* item
  )
{
  if (nullptr != item)
  {
    if (m_manifest_impl_sn != item->m_manifest_impl_sn)
    {
      ON_ERROR("item memory corruption.");
    }
    else
    {
      item->m_manifest_impl_sn = 0;
      item->m_manifest_table_sn = 0;
      m_item_PRIVATE__fsp.ReturnElement(item);
    }
  }
}